

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O3

int sqlite3_blob_open(sqlite3 *db,char *zDb,char *zTable,char *zColumn,sqlite_int64 iRow,int wrFlag,
                     sqlite3_blob **ppBlob)

{
  byte bVar1;
  short sVar2;
  Schema *pSVar3;
  Schema *pSVar4;
  int iVar5;
  uint uVar6;
  Incrblob *p;
  Table *pTVar7;
  Vdbe *p_00;
  VdbeOp *pVVar8;
  long lVar9;
  Schema **ppSVar10;
  sqlite3 *psVar11;
  char *pcVar12;
  char *pcVar13;
  ulong uVar14;
  FKey *pFVar15;
  ulong uVar16;
  Index *pIVar17;
  Vdbe *v;
  int p1;
  char *zErr;
  char *local_228;
  int local_21c;
  sqlite3 *local_218;
  VdbeOp *local_210;
  Table *local_208;
  ulong local_200;
  uint local_1f4;
  char *local_1f0;
  Incrblob *local_1e8;
  sqlite_int64 local_1e0;
  char *local_1d8;
  Parse local_1d0;
  
  local_228 = (char *)0x0;
  *ppBlob = (sqlite3_blob *)0x0;
  local_21c = wrFlag;
  local_1f0 = zTable;
  local_1e0 = iRow;
  local_1d8 = zDb;
  if (db->mutex != (sqlite3_mutex *)0x0) {
    (*sqlite3Config.mutex.xMutexEnter)(db->mutex);
  }
  p = (Incrblob *)sqlite3DbMallocZero(db,0x38);
  local_200 = 0;
  memset(&local_1d0,0,0x1a0);
  if (p != (Incrblob *)0x0) {
    uVar6 = 0;
    local_218 = db;
    local_1e8 = p;
    do {
      local_1d0.db = db;
      if (local_228 != (char *)0x0) {
        sqlite3DbFreeNN(db,local_228);
      }
      local_228 = (char *)0x0;
      if (db->noSharedCache == '\0') {
        btreeEnterAll(db);
      }
      pTVar7 = sqlite3LocateTable(&local_1d0,0,local_1f0,local_1d8);
      if (pTVar7 == (Table *)0x0) {
LAB_00152c2a:
        if (local_1d0.zErrMsg != (char *)0x0) {
          local_228 = local_1d0.zErrMsg;
          local_1d0.zErrMsg = (char *)0x0;
        }
        uVar6 = 1;
        if (db->noSharedCache == '\0') {
          btreeLeaveAll(db);
        }
        goto LAB_00152c8c;
      }
      if (pTVar7->nModuleArg != 0) {
        pcVar13 = "cannot open virtual table: %s";
LAB_00152c19:
        sqlite3ErrorMsg(&local_1d0,pcVar13,local_1f0);
        goto LAB_00152c2a;
      }
      if ((pTVar7->tabFlags & 0x20) != 0) {
        pcVar13 = "cannot open table without rowid: %s";
        goto LAB_00152c19;
      }
      if (pTVar7->pSelect != (Select *)0x0) {
        pcVar13 = "cannot open view: %s";
        goto LAB_00152c19;
      }
      p->pTab = pTVar7;
      if (pTVar7->pSchema == (Schema *)0x0) {
        lVar9 = -1000000;
      }
      else {
        lVar9 = -0x100000000;
        ppSVar10 = &db->aDb->pSchema;
        do {
          lVar9 = lVar9 + 0x100000000;
          pSVar3 = *ppSVar10;
          ppSVar10 = ppSVar10 + 4;
        } while (pSVar3 != pTVar7->pSchema);
        lVar9 = lVar9 >> 0x20;
      }
      p->zDb = db->aDb[lVar9].zDbSName;
      sVar2 = pTVar7->nCol;
      local_1f4 = uVar6;
      if (0 < sVar2) {
        uVar14 = 0;
LAB_001528bd:
        lVar9 = 0;
        do {
          bVar1 = pTVar7->aCol[uVar14].zName[lVar9];
          if (bVar1 == zColumn[lVar9]) {
            if ((ulong)bVar1 == 0) goto LAB_001528fe;
          }
          else if (""[bVar1] != ""[(byte)zColumn[lVar9]]) goto LAB_001528ef;
          lVar9 = lVar9 + 1;
        } while( true );
      }
      uVar14 = 0;
LAB_001528fe:
      uVar6 = (uint)uVar14;
      if (uVar6 == (int)sVar2) {
LAB_00152bf1:
        pcVar13 = "no such column: \"%s\"";
LAB_00152c62:
        local_228 = sqlite3MPrintf(db,pcVar13,zColumn);
        uVar6 = 1;
        if (db->noSharedCache == '\0') {
          btreeLeaveAll(db);
          uVar6 = 1;
        }
        goto LAB_00152c87;
      }
      if (local_21c != 0) {
        if (((db->flags & 0x4000) == 0) || (pFVar15 = pTVar7->pFKey, pFVar15 == (FKey *)0x0)) {
          pcVar12 = (char *)0x0;
        }
        else {
          pcVar12 = (char *)0x0;
          do {
            if (0 < (long)pFVar15->nCol) {
              lVar9 = 0;
              do {
                if (*(uint *)((long)&pFVar15->aCol[0].iFrom + lVar9) == uVar6) {
                  pcVar12 = "foreign key";
                }
                lVar9 = lVar9 + 0x10;
              } while ((long)pFVar15->nCol * 0x10 != lVar9);
            }
            pFVar15 = pFVar15->pNextFrom;
          } while (pFVar15 != (FKey *)0x0);
        }
        for (pIVar17 = pTVar7->pIndex; pIVar17 != (Index *)0x0; pIVar17 = pIVar17->pNext) {
          if ((ulong)pIVar17->nKeyCol != 0) {
            uVar16 = 0;
            do {
              if (uVar6 == (int)pIVar17->aiColumn[uVar16]) {
                pcVar12 = "indexed";
              }
              if ((int)pIVar17->aiColumn[uVar16] == 0xfffffffe) {
                pcVar12 = "indexed";
              }
              uVar16 = uVar16 + 1;
            } while (pIVar17->nKeyCol != uVar16);
          }
        }
        if (pcVar12 != (char *)0x0) {
          pcVar13 = "cannot open %s column for writing";
          zColumn = pcVar12;
          goto LAB_00152c62;
        }
      }
      local_208 = pTVar7;
      p_00 = sqlite3VdbeCreate(&local_1d0);
      p->pStmt = (sqlite3_stmt *)p_00;
      if (p_00 != (Vdbe *)0x0) {
        pSVar3 = local_208->pSchema;
        if (pSVar3 == (Schema *)0x0) {
          p1 = -1000000;
        }
        else {
          p1 = -1;
          ppSVar10 = &local_218->aDb->pSchema;
          do {
            p1 = p1 + 1;
            pSVar4 = *ppSVar10;
            ppSVar10 = ppSVar10 + 4;
          } while (pSVar4 != pSVar3);
        }
        local_210 = (VdbeOp *)CONCAT44(local_210._4_4_,pSVar3->iGeneration);
        iVar5 = sqlite3VdbeAddOp3(p_00,2,p1,(uint)(wrFlag != 0),pSVar3->schema_cookie);
        psVar11 = p_00->db;
        if (psVar11->mallocFailed == '\0') {
          psVar11 = (sqlite3 *)p_00->aOp;
          *(undefined1 *)((long)psVar11->aLimit + (long)iVar5 * 0x18 + -0x7b) = 0xfd;
          psVar11->aLimit[(long)iVar5 * 6 + -0x1b] = (int)local_210;
        }
        if (0 < (long)p_00->nOp) {
          psVar11 = (sqlite3 *)p_00->aOp;
          *(undefined2 *)((long)psVar11 + ((long)p_00->nOp + -1) * 0x18 + 2) = 1;
        }
        pVVar8 = sqlite3VdbeAddOpList(p_00,6,sqlite3_blob_open::openBlob,(int)psVar11);
        uVar6 = 1 << ((byte)p1 & 0x1f);
        p_00->btreeMask = p_00->btreeMask | uVar6;
        if ((p1 != 1) && ((p_00->db->aDb[p1].pBt)->sharable != '\0')) {
          p_00->lockMask = p_00->lockMask | uVar6;
        }
        if (local_218->mallocFailed == '\0') {
          pVVar8->p1 = p1;
          pVVar8->p2 = local_208->tnum;
          pVVar8->p3 = (uint)(wrFlag != 0);
          local_210 = pVVar8;
          sqlite3VdbeChangeP4(p_00,2,local_208->zName,0);
          if (local_218->mallocFailed == '\0') {
            if (local_21c != 0) {
              local_210[1].opcode = 'm';
            }
            local_210[1].p2 = local_208->tnum;
            local_210[1].p3 = p1;
            local_210[1].p4type = -3;
            local_210[1].p4.i = local_208->nCol + 1;
            local_210[3].p2 = (int)local_208->nCol;
            local_1d0.nVar = 0;
            local_1d0.nTab = 1;
            local_1d0.nMem = 1;
            sqlite3VdbeMakeReady(p_00,&local_1d0);
          }
        }
      }
      p = local_1e8;
      db = local_218;
      local_1e8->iCol = (u16)uVar14;
      local_1e8->db = local_218;
      if (local_218->noSharedCache == '\0') {
        btreeLeaveAll(local_218);
      }
      uVar6 = local_1f4;
      if (db->mallocFailed != '\0') goto LAB_00152bb2;
      uVar6 = blobSeekToRow(p,local_1e0,&local_228);
      if ((0x30 < (uint)local_200) || (uVar6 != 0x11)) goto LAB_00152bb2;
      local_200 = (ulong)((uint)local_200 + 1);
      memset(&local_1d0,0,0x1a0);
      uVar6 = 0x11;
    } while( true );
  }
LAB_00152bc2:
  uVar6 = 0;
  if (db->mallocFailed == '\0') {
    *ppBlob = (sqlite3_blob *)p;
    pcVar13 = "%s";
    if (local_228 == (char *)0x0) {
      pcVar13 = (char *)0x0;
    }
    uVar6 = 0;
    goto LAB_00152cbd;
  }
LAB_00152c87:
  if (p != (Incrblob *)0x0) goto LAB_00152c8c;
LAB_00152ca5:
  pcVar13 = "%s";
  if (local_228 == (char *)0x0) {
    pcVar13 = (char *)0x0;
  }
LAB_00152cbd:
  pcVar12 = local_228;
  sqlite3ErrorWithMsg(db,uVar6,pcVar13,local_228);
  if (pcVar12 != (char *)0x0) {
    sqlite3DbFreeNN(db,pcVar12);
  }
  sqlite3ParserReset(&local_1d0);
  if ((uVar6 == 0xc0a) || (db->mallocFailed != '\0')) {
    apiOomError(db);
    uVar6 = 7;
  }
  else {
    uVar6 = uVar6 & db->errMask;
  }
  if (db->mutex != (sqlite3_mutex *)0x0) {
    (*sqlite3Config.mutex.xMutexLeave)(db->mutex);
  }
  return uVar6;
LAB_001528ef:
  uVar14 = uVar14 + 1;
  if (uVar14 == (uint)(int)sVar2) goto LAB_00152bf1;
  goto LAB_001528bd;
LAB_00152bb2:
  if (uVar6 == 0) goto LAB_00152bc2;
LAB_00152c8c:
  if ((Vdbe *)p->pStmt != (Vdbe *)0x0) {
    sqlite3VdbeFinalize((Vdbe *)p->pStmt);
  }
  sqlite3DbFreeNN(db,p);
  goto LAB_00152ca5;
}

Assistant:

SQLITE_API int sqlite3_blob_open(
  sqlite3* db,            /* The database connection */
  const char *zDb,        /* The attached database containing the blob */
  const char *zTable,     /* The table containing the blob */
  const char *zColumn,    /* The column containing the blob */
  sqlite_int64 iRow,      /* The row containing the glob */
  int wrFlag,             /* True -> read/write access, false -> read-only */
  sqlite3_blob **ppBlob   /* Handle for accessing the blob returned here */
){
  int nAttempt = 0;
  int iCol;               /* Index of zColumn in row-record */
  int rc = SQLITE_OK;
  char *zErr = 0;
  Table *pTab;
  Incrblob *pBlob = 0;
  Parse sParse;

#ifdef SQLITE_ENABLE_API_ARMOR
  if( ppBlob==0 ){
    return SQLITE_MISUSE_BKPT;
  }
#endif
  *ppBlob = 0;
#ifdef SQLITE_ENABLE_API_ARMOR
  if( !sqlite3SafetyCheckOk(db) || zTable==0 ){
    return SQLITE_MISUSE_BKPT;
  }
#endif
  wrFlag = !!wrFlag;                /* wrFlag = (wrFlag ? 1 : 0); */

  sqlite3_mutex_enter(db->mutex);

  pBlob = (Incrblob *)sqlite3DbMallocZero(db, sizeof(Incrblob));
  do {
    memset(&sParse, 0, sizeof(Parse));
    if( !pBlob ) goto blob_open_out;
    sParse.db = db;
    sqlite3DbFree(db, zErr);
    zErr = 0;

    sqlite3BtreeEnterAll(db);
    pTab = sqlite3LocateTable(&sParse, 0, zTable, zDb);
    if( pTab && IsVirtual(pTab) ){
      pTab = 0;
      sqlite3ErrorMsg(&sParse, "cannot open virtual table: %s", zTable);
    }
    if( pTab && !HasRowid(pTab) ){
      pTab = 0;
      sqlite3ErrorMsg(&sParse, "cannot open table without rowid: %s", zTable);
    }
#ifndef SQLITE_OMIT_VIEW
    if( pTab && pTab->pSelect ){
      pTab = 0;
      sqlite3ErrorMsg(&sParse, "cannot open view: %s", zTable);
    }
#endif
    if( !pTab ){
      if( sParse.zErrMsg ){
        sqlite3DbFree(db, zErr);
        zErr = sParse.zErrMsg;
        sParse.zErrMsg = 0;
      }
      rc = SQLITE_ERROR;
      sqlite3BtreeLeaveAll(db);
      goto blob_open_out;
    }
    pBlob->pTab = pTab;
    pBlob->zDb = db->aDb[sqlite3SchemaToIndex(db, pTab->pSchema)].zDbSName;

    /* Now search pTab for the exact column. */
    for(iCol=0; iCol<pTab->nCol; iCol++) {
      if( sqlite3StrICmp(pTab->aCol[iCol].zName, zColumn)==0 ){
        break;
      }
    }
    if( iCol==pTab->nCol ){
      sqlite3DbFree(db, zErr);
      zErr = sqlite3MPrintf(db, "no such column: \"%s\"", zColumn);
      rc = SQLITE_ERROR;
      sqlite3BtreeLeaveAll(db);
      goto blob_open_out;
    }

    /* If the value is being opened for writing, check that the
    ** column is not indexed, and that it is not part of a foreign key. 
    */
    if( wrFlag ){
      const char *zFault = 0;
      Index *pIdx;
#ifndef SQLITE_OMIT_FOREIGN_KEY
      if( db->flags&SQLITE_ForeignKeys ){
        /* Check that the column is not part of an FK child key definition. It
        ** is not necessary to check if it is part of a parent key, as parent
        ** key columns must be indexed. The check below will pick up this 
        ** case.  */
        FKey *pFKey;
        for(pFKey=pTab->pFKey; pFKey; pFKey=pFKey->pNextFrom){
          int j;
          for(j=0; j<pFKey->nCol; j++){
            if( pFKey->aCol[j].iFrom==iCol ){
              zFault = "foreign key";
            }
          }
        }
      }
#endif
      for(pIdx=pTab->pIndex; pIdx; pIdx=pIdx->pNext){
        int j;
        for(j=0; j<pIdx->nKeyCol; j++){
          /* FIXME: Be smarter about indexes that use expressions */
          if( pIdx->aiColumn[j]==iCol || pIdx->aiColumn[j]==XN_EXPR ){
            zFault = "indexed";
          }
        }
      }
      if( zFault ){
        sqlite3DbFree(db, zErr);
        zErr = sqlite3MPrintf(db, "cannot open %s column for writing", zFault);
        rc = SQLITE_ERROR;
        sqlite3BtreeLeaveAll(db);
        goto blob_open_out;
      }
    }

    pBlob->pStmt = (sqlite3_stmt *)sqlite3VdbeCreate(&sParse);
    assert( pBlob->pStmt || db->mallocFailed );
    if( pBlob->pStmt ){
      
      /* This VDBE program seeks a btree cursor to the identified 
      ** db/table/row entry. The reason for using a vdbe program instead
      ** of writing code to use the b-tree layer directly is that the
      ** vdbe program will take advantage of the various transaction,
      ** locking and error handling infrastructure built into the vdbe.
      **
      ** After seeking the cursor, the vdbe executes an OP_ResultRow.
      ** Code external to the Vdbe then "borrows" the b-tree cursor and
      ** uses it to implement the blob_read(), blob_write() and 
      ** blob_bytes() functions.
      **
      ** The sqlite3_blob_close() function finalizes the vdbe program,
      ** which closes the b-tree cursor and (possibly) commits the 
      ** transaction.
      */
      static const int iLn = VDBE_OFFSET_LINENO(2);
      static const VdbeOpList openBlob[] = {
        {OP_TableLock,      0, 0, 0},  /* 0: Acquire a read or write lock */
        {OP_OpenRead,       0, 0, 0},  /* 1: Open a cursor */
        /* blobSeekToRow() will initialize r[1] to the desired rowid */
        {OP_NotExists,      0, 5, 1},  /* 2: Seek the cursor to rowid=r[1] */
        {OP_Column,         0, 0, 1},  /* 3  */
        {OP_ResultRow,      1, 0, 0},  /* 4  */
        {OP_Halt,           0, 0, 0},  /* 5  */
      };
      Vdbe *v = (Vdbe *)pBlob->pStmt;
      int iDb = sqlite3SchemaToIndex(db, pTab->pSchema);
      VdbeOp *aOp;

      sqlite3VdbeAddOp4Int(v, OP_Transaction, iDb, wrFlag, 
                           pTab->pSchema->schema_cookie,
                           pTab->pSchema->iGeneration);
      sqlite3VdbeChangeP5(v, 1);
      assert( sqlite3VdbeCurrentAddr(v)==2 || db->mallocFailed );
      aOp = sqlite3VdbeAddOpList(v, ArraySize(openBlob), openBlob, iLn);

      /* Make sure a mutex is held on the table to be accessed */
      sqlite3VdbeUsesBtree(v, iDb); 

      if( db->mallocFailed==0 ){
        assert( aOp!=0 );
        /* Configure the OP_TableLock instruction */
#ifdef SQLITE_OMIT_SHARED_CACHE
        aOp[0].opcode = OP_Noop;
#else
        aOp[0].p1 = iDb;
        aOp[0].p2 = pTab->tnum;
        aOp[0].p3 = wrFlag;
        sqlite3VdbeChangeP4(v, 2, pTab->zName, P4_TRANSIENT);
      }
      if( db->mallocFailed==0 ){
#endif

        /* Remove either the OP_OpenWrite or OpenRead. Set the P2 
        ** parameter of the other to pTab->tnum.  */
        if( wrFlag ) aOp[1].opcode = OP_OpenWrite;
        aOp[1].p2 = pTab->tnum;
        aOp[1].p3 = iDb;   

        /* Configure the number of columns. Configure the cursor to
        ** think that the table has one more column than it really
        ** does. An OP_Column to retrieve this imaginary column will
        ** always return an SQL NULL. This is useful because it means
        ** we can invoke OP_Column to fill in the vdbe cursors type 
        ** and offset cache without causing any IO.
        */
        aOp[1].p4type = P4_INT32;
        aOp[1].p4.i = pTab->nCol+1;
        aOp[3].p2 = pTab->nCol;

        sParse.nVar = 0;
        sParse.nMem = 1;
        sParse.nTab = 1;
        sqlite3VdbeMakeReady(v, &sParse);
      }
    }
   
    pBlob->iCol = iCol;
    pBlob->db = db;
    sqlite3BtreeLeaveAll(db);
    if( db->mallocFailed ){
      goto blob_open_out;
    }
    rc = blobSeekToRow(pBlob, iRow, &zErr);
  } while( (++nAttempt)<SQLITE_MAX_SCHEMA_RETRY && rc==SQLITE_SCHEMA );

blob_open_out:
  if( rc==SQLITE_OK && db->mallocFailed==0 ){
    *ppBlob = (sqlite3_blob *)pBlob;
  }else{
    if( pBlob && pBlob->pStmt ) sqlite3VdbeFinalize((Vdbe *)pBlob->pStmt);
    sqlite3DbFree(db, pBlob);
  }
  sqlite3ErrorWithMsg(db, rc, (zErr ? "%s" : 0), zErr);
  sqlite3DbFree(db, zErr);
  sqlite3ParserReset(&sParse);
  rc = sqlite3ApiExit(db, rc);
  sqlite3_mutex_leave(db->mutex);
  return rc;
}